

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qprintpreviewwidget.cpp
# Opt level: O0

int __thiscall QPrintPreviewWidgetPrivate::init(QPrintPreviewWidgetPrivate *this,EVP_PKEY_CTX *ctx)

{
  QBrush *pQVar1;
  GraphicsView *pGVar2;
  QWidget *pQVar3;
  GraphicsView *this_00;
  char *pcVar4;
  QGraphicsScene *this_01;
  QVBoxLayout *this_02;
  long in_FS_OFFSET;
  QVBoxLayout *layout;
  QPrintPreviewWidget *q;
  QWidget *in_stack_ffffffffffffff58;
  QBrush local_20 [8];
  QObject local_18 [8];
  QObject local_10 [8];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar3 = &q_func(this)->super_QWidget;
  this_00 = (GraphicsView *)operator_new(0x28);
  QtPrivate::GraphicsView::GraphicsView(this_00,in_stack_ffffffffffffff58);
  this->graphicsView = this_00;
  QGraphicsView::setInteractive(SUB81(this->graphicsView,0));
  QGraphicsView::setDragMode((DragMode)this->graphicsView);
  QGraphicsView::setViewportUpdateMode((ViewportUpdateMode)this->graphicsView);
  pcVar4 = (char *)QAbstractScrollArea::verticalScrollBar();
  QObject::connect(local_10,pcVar4,(QObject *)"2valueChanged(int)",(char *)pQVar3,0x183e7f);
  QMetaObject::Connection::~Connection((Connection *)local_10);
  QObject::connect(local_18,(char *)this->graphicsView,(QObject *)"2resized()",(char *)pQVar3,
                   0x183ea2);
  QMetaObject::Connection::~Connection((Connection *)local_18);
  this_01 = (QGraphicsScene *)operator_new(0x10);
  QGraphicsScene::QGraphicsScene(this_01,(QObject *)this->graphicsView);
  this->scene = this_01;
  pQVar1 = (QBrush *)this->scene;
  QBrush::QBrush(local_20,gray,SolidPattern);
  QGraphicsScene::setBackgroundBrush(pQVar1);
  QBrush::~QBrush(local_20);
  QGraphicsView::setScene((QGraphicsScene *)this->graphicsView);
  this_02 = (QVBoxLayout *)operator_new(0x20);
  QVBoxLayout::QVBoxLayout(this_02,pQVar3);
  QLayout::setContentsMargins((int)this_02,0,0,0);
  pGVar2 = this->graphicsView;
  QFlags<Qt::AlignmentFlag>::QFlags((QFlags<Qt::AlignmentFlag> *)0x158b7a);
  QBoxLayout::addWidget((QWidget *)this_02,(int)pGVar2,(QFlags_conflict *)0x0);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (int)*(long *)(in_FS_OFFSET + 0x28);
  }
  __stack_chk_fail();
}

Assistant:

void QPrintPreviewWidgetPrivate::init()
{
    Q_Q(QPrintPreviewWidget);

    graphicsView = new GraphicsView;
    graphicsView->setInteractive(false);
    graphicsView->setDragMode(QGraphicsView::ScrollHandDrag);
    graphicsView->setViewportUpdateMode(QGraphicsView::SmartViewportUpdate);
    QObject::connect(graphicsView->verticalScrollBar(), SIGNAL(valueChanged(int)),
                     q, SLOT(_q_updateCurrentPage()));
    QObject::connect(graphicsView, SIGNAL(resized()), q, SLOT(_q_fit()));

    scene = new QGraphicsScene(graphicsView);
    scene->setBackgroundBrush(Qt::gray);
    graphicsView->setScene(scene);

    QVBoxLayout *layout = new QVBoxLayout(q);
    layout->setContentsMargins(0, 0, 0, 0);
    layout->addWidget(graphicsView);
}